

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseF64(WastParser *this,Const *const_,ConstType const_type)

{
  char *s;
  Result RVar1;
  Literal *pLVar2;
  ExpectedNan expected;
  uint64_t f64_bits;
  Token token;
  
  if ((const_type == Expectation) && (RVar1 = ParseExpectedNan(this,&expected), RVar1.enum_ == Ok))
  {
    Const::set_f64(const_,expected);
    return (Result)Ok;
  }
  Consume(&token,this);
  if (token.token_type_ - First_Literal < 3) {
    pLVar2 = Token::literal(&token);
    s = (pLVar2->text)._M_str;
    RVar1 = ParseDouble(pLVar2->type,s,s + (pLVar2->text)._M_len,&f64_bits);
    Const::set_f64(const_,f64_bits);
  }
  else {
    RVar1.enum_ = Error;
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WastParser::ParseF64(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f64(expected);
    return Result::Ok;
  }

  auto token = Consume();
  if (!token.HasLiteral()) {
    return Result::Error;
  }

  auto literal = token.literal();
  uint64_t f64_bits;
  Result result = ParseDouble(literal.type, literal.text, &f64_bits);
  const_->set_f64(f64_bits);
  return result;
}